

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeprovider.cpp
# Opt level: O1

void __thiscall stackjit::TypeProvider::~TypeProvider(TypeProvider *this)

{
  _Hash_node_base *p_Var1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>
  type;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  _Hash_node_base *local_28;
  
  p_Var1 = (this->mTypes)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_48,p_Var1[1]._M_nxt,
                 (long)&(p_Var1[1]._M_nxt)->_M_nxt + (long)&(p_Var1[2]._M_nxt)->_M_nxt);
      local_28 = p_Var1[5]._M_nxt;
      if (local_28 != (_Hash_node_base *)0x0) {
        (*(code *)local_28->_M_nxt[1]._M_nxt)();
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this);
  return;
}

Assistant:

TypeProvider::~TypeProvider() {
		for (auto type : mTypes) {
	        delete type.second;
	    }
	}